

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O2

UChar32 * u_strToUTF32WithSub_63
                    (UChar32 *dest,int32_t destCapacity,int32_t *pDestLength,UChar *src,
                    int32_t srcLength,UChar32 subchar,int32_t *pNumSubstitutions,
                    UErrorCode *pErrorCode)

{
  UChar UVar1;
  UChar *pUVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  int iVar7;
  uint *puVar8;
  UChar *pUVar9;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((((-1 < destCapacity) && (-2 < srcLength)) && (src != (UChar *)0x0 || srcLength == 0)) &&
       ((subchar < 0x110000 && (destCapacity == 0 || dest != (UChar32 *)0x0)) &&
        (subchar & 0xfffff800U) != 0xd800)) {
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = 0;
      }
      puVar6 = (uint *)(dest + (uint)destCapacity);
      if (dest == (UChar32 *)0x0) {
        puVar6 = (uint *)0x0;
      }
      puVar8 = (uint *)dest;
      if (srcLength < 0) {
        iVar7 = 0;
        while ((uVar5 = (uint)(ushort)*src, *src != L'\0' && ((uVar5 & 0xf800) != 0xd800))) {
          if (puVar8 < puVar6) {
            *puVar8 = uVar5;
            puVar8 = puVar8 + 1;
            src = src + 1;
          }
          else {
            src = src + 1;
            iVar7 = iVar7 + 1;
          }
        }
        pUVar9 = src;
        if (uVar5 != 0) {
          do {
            pUVar2 = pUVar9 + 1;
            pUVar9 = pUVar9 + 1;
          } while (*pUVar2 != L'\0');
        }
      }
      else {
        pUVar9 = src + (uint)srcLength;
        if (src == (UChar *)0x0) {
          pUVar9 = src;
        }
        iVar7 = 0;
      }
      uVar3 = (long)puVar8 - (long)dest;
      iVar4 = 0;
      do {
        if (pUVar9 <= src) {
          iVar7 = (int)(uVar3 >> 2) + iVar7;
          if (pDestLength != (int32_t *)0x0) {
            *pDestLength = iVar7;
          }
          if (pNumSubstitutions != (int32_t *)0x0) {
            *pNumSubstitutions = iVar4;
          }
          u_terminateUChar32s_63(dest,destCapacity,iVar7,pErrorCode);
          return dest;
        }
        pUVar2 = src + 1;
        uVar5 = (uint)(ushort)*src;
        if ((uVar5 & 0xf800) == 0xd800) {
          if ((pUVar2 < pUVar9 && ((ushort)*src >> 10 & 1) == 0) &&
             (UVar1 = *pUVar2, ((ushort)UVar1 & 0xfc00) == 0xdc00)) {
            pUVar2 = src + 2;
            uVar5 = uVar5 * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
          }
          else {
            if (subchar < 0) {
              *pErrorCode = U_INVALID_CHAR_FOUND;
              return (UChar32 *)0x0;
            }
            iVar4 = iVar4 + 1;
            uVar5 = subchar;
          }
        }
        src = pUVar2;
        if (puVar8 < puVar6) {
          *puVar8 = uVar5;
          puVar8 = puVar8 + 1;
          uVar3 = uVar3 + 4;
        }
        else {
          iVar7 = iVar7 + 1;
        }
      } while( true );
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (UChar32 *)0x0;
}

Assistant:

U_CAPI UChar32* U_EXPORT2 
u_strToUTF32WithSub(UChar32 *dest,
             int32_t destCapacity,
             int32_t *pDestLength,
             const UChar *src,
             int32_t srcLength,
             UChar32 subchar, int32_t *pNumSubstitutions,
             UErrorCode *pErrorCode) {
    const UChar *srcLimit;
    UChar32 ch;
    UChar ch2;
    UChar32 *destLimit;
    UChar32 *pDest;
    int32_t reqLength;
    int32_t numSubstitutions;

    /* args check */
    if(U_FAILURE(*pErrorCode)){
        return NULL;
    }
    if( (src==NULL && srcLength!=0) || srcLength < -1 ||
        (destCapacity<0) || (dest == NULL && destCapacity > 0) ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions != NULL) {
        *pNumSubstitutions = 0;
    }

    pDest = dest;
    destLimit = (dest!=NULL)?(dest + destCapacity):NULL;
    reqLength = 0;
    numSubstitutions = 0;

    if(srcLength < 0) {
        /* simple loop for conversion of a NUL-terminated BMP string */
        while((ch=*src) != 0 && !U16_IS_SURROGATE(ch)) {
            ++src;
            if(pDest < destLimit) {
                *pDest++ = ch;
            } else {
                ++reqLength;
            }
        }
        srcLimit = src;
        if(ch != 0) {
            /* "complicated" case, find the end of the remaining string */
            while(*++srcLimit != 0) {}
        }
    } else {
        srcLimit = (src!=NULL)?(src + srcLength):NULL;
    }

    /* convert with length */
    while(src < srcLimit) {
        ch = *src++;
        if(!U16_IS_SURROGATE(ch)) {
            /* write or count ch below */
        } else if(U16_IS_SURROGATE_LEAD(ch) && src < srcLimit && U16_IS_TRAIL(ch2 = *src)) {
            ++src;
            ch = U16_GET_SUPPLEMENTARY(ch, ch2);
        } else if((ch = subchar) < 0) {
            /* unpaired surrogate */
            *pErrorCode = U_INVALID_CHAR_FOUND;
            return NULL;
        } else {
            ++numSubstitutions;
        }
        if(pDest < destLimit) {
            *pDest++ = ch;
        } else {
            ++reqLength;
        }
    }

    reqLength += (int32_t)(pDest - dest);
    if(pDestLength) {
        *pDestLength = reqLength;
    }
    if(pNumSubstitutions != NULL) {
        *pNumSubstitutions = numSubstitutions;
    }

    /* Terminate the buffer */
    u_terminateUChar32s(dest, destCapacity, reqLength, pErrorCode);

    return dest;
}